

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRCombinedImageSampler * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::
allocate<spirv_cross::SPIRCombinedImageSampler&>
          (ObjectPool<spirv_cross::SPIRCombinedImageSampler> *this,SPIRCombinedImageSampler *p)

{
  Vector<spirv_cross::SPIRCombinedImageSampler_*> *this_00;
  size_t sVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>
  _Var2;
  _Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false> _Var3;
  ulong count;
  SPIRCombinedImageSampler *pSVar4;
  
  this_00 = &this->vacants;
  if ((this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.buffer_size == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>)malloc(count * 0x18);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>._M_head_impl !=
        (SPIRCombinedImageSampler *)0x0) {
      SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::reserve(this_00,count);
      _Var3._M_head_impl =
           (SPIRCombinedImageSampler *)
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>._M_head_impl;
      for (; count != 0; count = count - 1) {
        SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::reserve
                  (this_00,(this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>
                           .buffer_size + 1);
        sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.
                buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.ptr[sVar1] =
             _Var3._M_head_impl;
        (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.buffer_size =
             sVar1 + 1;
        _Var3._M_head_impl = _Var3._M_head_impl + 1;
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false> =
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>._M_head_impl
          != (SPIRCombinedImageSampler *)0x0) goto LAB_002041fc;
    }
    pSVar4 = (SPIRCombinedImageSampler *)0x0;
  }
  else {
LAB_002041fc:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.buffer_size;
    pSVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.ptr
             [sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::resize(this_00,sVar1 - 1);
    }
    (pSVar4->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_0049df28;
    (pSVar4->super_IVariant).self.id = (p->super_IVariant).self.id;
    (pSVar4->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_0049dfd0;
    *(undefined8 *)&(pSVar4->super_IVariant).field_0xc =
         *(undefined8 *)&(p->super_IVariant).field_0xc;
    (pSVar4->sampler).id = (p->sampler).id;
  }
  return pSVar4;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}